

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O3

UChar * u_memset_63(UChar *dest,UChar c,int32_t count)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  UChar *ptr;
  ulong uVar10;
  UChar *pUVar11;
  long lVar12;
  int iVar14;
  undefined1 auVar13 [16];
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar26;
  int iVar31;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int iVar32;
  int iVar34;
  undefined1 auVar33 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar37 [16];
  
  auVar9 = _DAT_0039a8f0;
  auVar8 = _DAT_0039a8e0;
  auVar7 = _DAT_0039a8d0;
  auVar6 = _DAT_00399dd0;
  auVar5 = _DAT_00399dc0;
  ptr = dest;
  if (0 < count) {
    pUVar11 = (UChar *)((ulong)(uint)(count * 2) + (long)dest);
    if (pUVar11 <= dest + 1) {
      pUVar11 = dest + 1;
    }
    uVar10 = ~(ulong)dest + (long)pUVar11;
    auVar17._8_4_ = (int)uVar10;
    auVar17._0_8_ = uVar10;
    auVar17._12_4_ = (int)(uVar10 >> 0x20);
    auVar13._0_8_ = uVar10 >> 1;
    auVar13._8_8_ = auVar17._8_8_ >> 1;
    lVar12 = 0;
    auVar13 = auVar13 ^ _DAT_00399dd0;
    do {
      auVar25._8_4_ = (int)lVar12;
      auVar25._0_8_ = lVar12;
      auVar25._12_4_ = (int)((ulong)lVar12 >> 0x20);
      auVar17 = (auVar25 | auVar5) ^ auVar6;
      iVar26 = auVar13._0_4_;
      iVar32 = -(uint)(iVar26 < auVar17._0_4_);
      iVar14 = auVar13._4_4_;
      auVar18._4_4_ = -(uint)(iVar14 < auVar17._4_4_);
      iVar31 = auVar13._8_4_;
      iVar34 = -(uint)(iVar31 < auVar17._8_4_);
      iVar15 = auVar13._12_4_;
      auVar18._12_4_ = -(uint)(iVar15 < auVar17._12_4_);
      auVar27._4_4_ = iVar32;
      auVar27._0_4_ = iVar32;
      auVar27._8_4_ = iVar34;
      auVar27._12_4_ = iVar34;
      auVar35 = pshuflw(in_XMM11,auVar27,0xe8);
      auVar20._4_4_ = -(uint)(auVar17._4_4_ == iVar14);
      auVar20._12_4_ = -(uint)(auVar17._12_4_ == iVar15);
      auVar20._0_4_ = auVar20._4_4_;
      auVar20._8_4_ = auVar20._12_4_;
      auVar37 = pshuflw(in_XMM12,auVar20,0xe8);
      auVar18._0_4_ = auVar18._4_4_;
      auVar18._8_4_ = auVar18._12_4_;
      auVar17 = pshuflw(auVar35,auVar18,0xe8);
      auVar36._8_4_ = 0xffffffff;
      auVar36._0_8_ = 0xffffffffffffffff;
      auVar36._12_4_ = 0xffffffff;
      auVar36 = (auVar17 | auVar37 & auVar35) ^ auVar36;
      auVar17 = packssdw(auVar36,auVar36);
      if ((auVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        dest[lVar12] = c;
      }
      auVar18 = auVar20 & auVar27 | auVar18;
      auVar17 = packssdw(auVar18,auVar18);
      auVar1._8_4_ = 0xffffffff;
      auVar1._0_8_ = 0xffffffffffffffff;
      auVar1._12_4_ = 0xffffffff;
      auVar17 = packssdw(auVar17 ^ auVar1,auVar17 ^ auVar1);
      if ((auVar17._0_4_ >> 0x10 & 1) != 0) {
        dest[lVar12 + 1] = c;
      }
      auVar17 = (auVar25 | auVar9) ^ auVar6;
      iVar32 = -(uint)(iVar26 < auVar17._0_4_);
      auVar33._4_4_ = -(uint)(iVar14 < auVar17._4_4_);
      iVar34 = -(uint)(iVar31 < auVar17._8_4_);
      auVar33._12_4_ = -(uint)(iVar15 < auVar17._12_4_);
      auVar19._4_4_ = iVar32;
      auVar19._0_4_ = iVar32;
      auVar19._8_4_ = iVar34;
      auVar19._12_4_ = iVar34;
      auVar28._4_4_ = -(uint)(auVar17._4_4_ == iVar14);
      auVar28._12_4_ = -(uint)(auVar17._12_4_ == iVar15);
      auVar28._0_4_ = auVar28._4_4_;
      auVar28._8_4_ = auVar28._12_4_;
      auVar33._0_4_ = auVar33._4_4_;
      auVar33._8_4_ = auVar33._12_4_;
      auVar17 = auVar28 & auVar19 | auVar33;
      auVar17 = packssdw(auVar17,auVar17);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar17 = packssdw(auVar17 ^ auVar2,auVar17 ^ auVar2);
      if ((auVar17 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        dest[lVar12 + 2] = c;
      }
      auVar36 = pshufhw(auVar19,auVar19,0x84);
      auVar18 = pshufhw(auVar28,auVar28,0x84);
      auVar20 = pshufhw(auVar36,auVar33,0x84);
      auVar21._8_4_ = 0xffffffff;
      auVar21._0_8_ = 0xffffffffffffffff;
      auVar21._12_4_ = 0xffffffff;
      auVar21 = (auVar20 | auVar18 & auVar36) ^ auVar21;
      auVar36 = packssdw(auVar21,auVar21);
      if ((auVar36 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        dest[lVar12 + 3] = c;
      }
      auVar36 = (auVar25 | auVar8) ^ auVar6;
      iVar32 = -(uint)(iVar26 < auVar36._0_4_);
      auVar23._4_4_ = -(uint)(iVar14 < auVar36._4_4_);
      iVar34 = -(uint)(iVar31 < auVar36._8_4_);
      auVar23._12_4_ = -(uint)(iVar15 < auVar36._12_4_);
      auVar29._4_4_ = iVar32;
      auVar29._0_4_ = iVar32;
      auVar29._8_4_ = iVar34;
      auVar29._12_4_ = iVar34;
      auVar17 = pshuflw(auVar17,auVar29,0xe8);
      auVar22._4_4_ = -(uint)(auVar36._4_4_ == iVar14);
      auVar22._12_4_ = -(uint)(auVar36._12_4_ == iVar15);
      auVar22._0_4_ = auVar22._4_4_;
      auVar22._8_4_ = auVar22._12_4_;
      auVar36 = pshuflw(auVar37 & auVar35,auVar22,0xe8);
      in_XMM12 = auVar36 & auVar17;
      auVar23._0_4_ = auVar23._4_4_;
      auVar23._8_4_ = auVar23._12_4_;
      auVar17 = pshuflw(auVar17,auVar23,0xe8);
      auVar35._8_4_ = 0xffffffff;
      auVar35._0_8_ = 0xffffffffffffffff;
      auVar35._12_4_ = 0xffffffff;
      auVar35 = (auVar17 | in_XMM12) ^ auVar35;
      in_XMM11 = packssdw(auVar35,auVar35);
      if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        dest[lVar12 + 4] = c;
      }
      auVar23 = auVar22 & auVar29 | auVar23;
      auVar17 = packssdw(auVar23,auVar23);
      auVar37._8_4_ = 0xffffffff;
      auVar37._0_8_ = 0xffffffffffffffff;
      auVar37._12_4_ = 0xffffffff;
      auVar17 = packssdw(auVar17 ^ auVar37,auVar17 ^ auVar37);
      if ((auVar17 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        dest[lVar12 + 5] = c;
      }
      auVar17 = (auVar25 | auVar7) ^ auVar6;
      iVar26 = -(uint)(iVar26 < auVar17._0_4_);
      auVar30._4_4_ = -(uint)(iVar14 < auVar17._4_4_);
      iVar31 = -(uint)(iVar31 < auVar17._8_4_);
      auVar30._12_4_ = -(uint)(iVar15 < auVar17._12_4_);
      auVar24._4_4_ = iVar26;
      auVar24._0_4_ = iVar26;
      auVar24._8_4_ = iVar31;
      auVar24._12_4_ = iVar31;
      auVar16._4_4_ = -(uint)(auVar17._4_4_ == iVar14);
      auVar16._12_4_ = -(uint)(auVar17._12_4_ == iVar15);
      auVar16._0_4_ = auVar16._4_4_;
      auVar16._8_4_ = auVar16._12_4_;
      auVar30._0_4_ = auVar30._4_4_;
      auVar30._8_4_ = auVar30._12_4_;
      auVar17 = auVar16 & auVar24 | auVar30;
      auVar17 = packssdw(auVar17,auVar17);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar17 = packssdw(auVar17 ^ auVar3,auVar17 ^ auVar3);
      if ((auVar17 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        dest[lVar12 + 6] = c;
      }
      auVar36 = pshufhw(auVar24,auVar24,0x84);
      auVar17 = pshufhw(auVar16,auVar16,0x84);
      auVar25 = pshufhw(auVar36,auVar30,0x84);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar17 = packssdw(auVar17 & auVar36,(auVar25 | auVar17 & auVar36) ^ auVar4);
      if ((auVar17 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        dest[lVar12 + 7] = c;
      }
      lVar12 = lVar12 + 8;
    } while ((uVar10 >> 4) * 8 + 8 != lVar12);
  }
  return ptr;
}

Assistant:

U_CAPI UChar * U_EXPORT2
u_memset(UChar *dest, UChar c, int32_t count) {
    if(count > 0) {
        UChar *ptr = dest;
        UChar *limit = dest + count;

        while (ptr < limit) {
            *(ptr++) = c;
        }
    }
    return dest;
}